

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

idx_t duckdb_get_list_size(duckdb_value value)

{
  vector<duckdb::Value,_true> *pvVar1;
  idx_t iVar2;
  Value val;
  Value local_48;
  
  if (value == (duckdb_value)0x0) {
    iVar2 = 0;
  }
  else {
    duckdb::Value::Value(&local_48,(Value *)value);
    if ((local_48.type_.id_ == LIST) && (local_48.is_null == false)) {
      pvVar1 = duckdb::ListValue::GetChildren(&local_48);
      iVar2 = (long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6;
    }
    else {
      iVar2 = 0;
    }
    duckdb::Value::~Value(&local_48);
  }
  return iVar2;
}

Assistant:

idx_t duckdb_get_list_size(duckdb_value value) {
	if (!value) {
		return 0;
	}

	auto val = UnwrapValue(value);
	if (val.type().id() != LogicalTypeId::LIST || val.IsNull()) {
		return 0;
	}

	auto &children = duckdb::ListValue::GetChildren(val);
	return children.size();
}